

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_seek_to_first_pcm_frame(ma_dr_wav *pWav)

{
  int iVar1;
  long in_RDI;
  ma_bool32 local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    iVar1 = (**(code **)(in_RDI + 0x10))
                      (*(undefined8 *)(in_RDI + 0x18),*(ulong *)(in_RDI + 0x88) & 0xffffffff,0);
    if (iVar1 == 0) {
      local_8 = 0;
    }
    else {
      if (*(short *)(in_RDI + 0x74) == 2 || *(short *)(in_RDI + 0x74) == 0x11) {
        if (*(short *)(in_RDI + 0x74) == 2) {
          memset((void *)(in_RDI + 0x100),0,0x34);
        }
        else if (*(short *)(in_RDI + 0x74) == 0x11) {
          memset((void *)(in_RDI + 0x134),0,0x58);
        }
      }
      *(undefined8 *)(in_RDI + 0x98) = 0;
      *(undefined8 *)(in_RDI + 0x90) = *(undefined8 *)(in_RDI + 0x80);
      local_8 = 1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_seek_to_first_pcm_frame(ma_dr_wav* pWav)
{
    if (pWav->onWrite != NULL) {
        return MA_FALSE;
    }
    if (!pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos, ma_dr_wav_seek_origin_start)) {
        return MA_FALSE;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
            MA_DR_WAV_ZERO_OBJECT(&pWav->msadpcm);
        } else if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
            MA_DR_WAV_ZERO_OBJECT(&pWav->ima);
        } else {
            MA_DR_WAV_ASSERT(MA_FALSE);
        }
    }
    pWav->readCursorInPCMFrames = 0;
    pWav->bytesRemaining = pWav->dataChunkDataSize;
    return MA_TRUE;
}